

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.h
# Opt level: O3

ostream * Eigen::internal::print_matrix<Eigen::Matrix<std::complex<double>,_1,1,0,_1,1>>
                    (ostream *s,Matrix<std::complex<double>,__1,_1,_0,__1,_1> *_m,IOFormat *fmt)

{
  int iVar1;
  bool bVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  stringstream sstr;
  long local_1f8;
  undefined8 local_1f0;
  undefined1 *local_1d8;
  long local_1d0;
  undefined1 local_1c8 [16];
  long local_1b8 [2];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  lVar6 = (_m->super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>).
          m_storage.m_rows;
  if (lVar6 == 0) {
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (s,(fmt->matPrefix)._M_dataplus._M_p,(fmt->matPrefix)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,(fmt->matSuffix)._M_dataplus._M_p,(fmt->matSuffix)._M_string_length);
    return s;
  }
  iVar1 = fmt->precision;
  lVar5 = (long)iVar1;
  if (lVar5 == -2) {
    lVar5 = 0x10;
  }
  else {
    bVar2 = true;
    if ((iVar1 == -1) || (iVar1 == 0)) {
      local_1f0 = 0;
      goto LAB_0012d74e;
    }
  }
  local_1f0 = *(undefined8 *)(s + *(long *)(*(long *)s + -0x18) + 8);
  *(long *)(s + *(long *)(*(long *)s + -0x18) + 8) = lVar5;
  bVar2 = false;
LAB_0012d74e:
  if (((fmt->flags & 1) == 0) && (0 < lVar6)) {
    lVar6 = 0;
    lVar5 = 0;
    local_1f8 = 0;
    do {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::ios::copyfmt((ios *)((stringstream *)local_1b8 + *(long *)(local_1b8[0] + -0x18)));
      std::operator<<(local_1a8,
                      (complex *)
                      (((_m->
                        super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>
                        ).m_storage.m_data)->_M_value + lVar6));
      std::__cxx11::stringbuf::str();
      if (local_1f8 <= local_1d0) {
        local_1f8 = local_1d0;
      }
      if (local_1d8 != local_1c8) {
        operator_delete(local_1d8);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + 0x10;
    } while (lVar5 < (_m->
                     super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>).
                     m_storage.m_rows);
  }
  else {
    local_1f8 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (s,(fmt->matPrefix)._M_dataplus._M_p,(fmt->matPrefix)._M_string_length);
  if (0 < (_m->super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>).
          m_storage.m_rows) {
    lVar5 = 0;
    lVar6 = 0;
    do {
      if (lVar6 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (s,(fmt->rowSpacer)._M_dataplus._M_p,(fmt->rowSpacer)._M_string_length);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (s,(fmt->rowPrefix)._M_dataplus._M_p,(fmt->rowPrefix)._M_string_length);
      if (local_1f8 != 0) {
        *(long *)(s + *(long *)(*(long *)s + -0x18) + 0x10) = local_1f8;
      }
      std::operator<<(s,(complex *)
                        (((_m->
                          super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>
                          ).m_storage.m_data)->_M_value + lVar5));
      std::__ostream_insert<char,std::char_traits<char>>
                (s,(fmt->rowSuffix)._M_dataplus._M_p,(fmt->rowSuffix)._M_string_length);
      lVar4 = (_m->super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>).
              m_storage.m_rows;
      if (lVar6 < lVar4 + -1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (s,(fmt->rowSeparator)._M_dataplus._M_p,(fmt->rowSeparator)._M_string_length);
        lVar4 = (_m->super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>).
                m_storage.m_rows;
      }
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x10;
    } while (lVar6 < lVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (s,(fmt->matSuffix)._M_dataplus._M_p,(fmt->matSuffix)._M_string_length);
  if (!bVar2) {
    *(undefined8 *)(s + *(long *)(*(long *)s + -0x18) + 8) = local_1f0;
  }
  return s;
}

Assistant:

std::ostream & print_matrix(std::ostream & s, const Derived& _m, const IOFormat& fmt)
{
  if(_m.size() == 0)
  {
    s << fmt.matPrefix << fmt.matSuffix;
    return s;
  }
  
  typename Derived::Nested m = _m;
  typedef typename Derived::Scalar Scalar;
  typedef typename Derived::Index Index;

  Index width = 0;

  std::streamsize explicit_precision;
  if(fmt.precision == StreamPrecision)
  {
    explicit_precision = 0;
  }
  else if(fmt.precision == FullPrecision)
  {
    if (NumTraits<Scalar>::IsInteger)
    {
      explicit_precision = 0;
    }
    else
    {
      explicit_precision = significant_decimals_impl<Scalar>::run();
    }
  }
  else
  {
    explicit_precision = fmt.precision;
  }

  std::streamsize old_precision = 0;
  if(explicit_precision) old_precision = s.precision(explicit_precision);

  bool align_cols = !(fmt.flags & DontAlignCols);
  if(align_cols)
  {
    // compute the largest width
    for(Index j = 0; j < m.cols(); ++j)
      for(Index i = 0; i < m.rows(); ++i)
      {
        std::stringstream sstr;
        sstr.copyfmt(s);
        sstr << m.coeff(i,j);
        width = std::max<Index>(width, Index(sstr.str().length()));
      }
  }
  s << fmt.matPrefix;
  for(Index i = 0; i < m.rows(); ++i)
  {
    if (i)
      s << fmt.rowSpacer;
    s << fmt.rowPrefix;
    if(width) s.width(width);
    s << m.coeff(i, 0);
    for(Index j = 1; j < m.cols(); ++j)
    {
      s << fmt.coeffSeparator;
      if (width) s.width(width);
      s << m.coeff(i, j);
    }
    s << fmt.rowSuffix;
    if( i < m.rows() - 1)
      s << fmt.rowSeparator;
  }
  s << fmt.matSuffix;
  if(explicit_precision) s.precision(old_precision);
  return s;
}